

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtrGroup.c
# Opt level: O1

int Mtr_SwapGroups(MtrNode *first,MtrNode *second)

{
  MtrHalfWord MVar1;
  MtrHalfWord shift;
  MtrNode *pMVar2;
  int iVar3;
  MtrNode **ppMVar4;
  MtrNode *node;
  bool bVar5;
  
  node = first;
  if ((((second->younger == first) ||
       (bVar5 = first->younger == second, node = second, second = first, bVar5)) &&
      (pMVar2 = second->parent, pMVar2 != (MtrNode *)0x0)) && (node->parent == pMVar2)) {
    if (pMVar2->child == second) {
      ppMVar4 = &pMVar2->child;
    }
    else {
      ppMVar4 = &second->elder->younger;
    }
    MVar1 = second->size;
    shift = node->size;
    *ppMVar4 = node;
    pMVar2 = node->younger;
    if (pMVar2 != (MtrNode *)0x0) {
      pMVar2->elder = second;
    }
    second->younger = pMVar2;
    node->elder = second->elder;
    second->elder = node;
    node->younger = second;
    iVar3 = mtrShiftHL(second,shift);
    if (iVar3 != 0) {
      iVar3 = mtrShiftHL(node,-MVar1);
      return iVar3;
    }
  }
  return 0;
}

Assistant:

int
Mtr_SwapGroups(
  MtrNode * first /* first node to be swapped */,
  MtrNode * second /* second node to be swapped */)
{
    MtrNode *node;
    MtrNode *parent;
    int sizeFirst;
    int sizeSecond;

    if (second->younger == first) { /* make first first */
        node = first;
        first = second;
        second = node;
    } else if (first->younger != second) { /* non-adjacent */
        return(0);
    }

    sizeFirst = first->size;
    sizeSecond = second->size;

    /* Swap the two nodes. */
    parent = first->parent;
    if (parent == NULL || second->parent != parent) return(0);
    if (parent->child == first) {
        parent->child = second;
    } else { /* first->elder != NULL */
        first->elder->younger = second;
    }
    if (second->younger != NULL) {
        second->younger->elder = first;
    }
    first->younger = second->younger;
    second->elder = first->elder;
    first->elder = second;
    second->younger = first;

    /* Adjust the high and low fields. */
    if (!mtrShiftHL(first,sizeSecond)) return(0);
    if (!mtrShiftHL(second,-sizeFirst)) return(0);

    return(1);

}